

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::SourceCodeInfo::InternalSerializeWithCachedSizesToArray
          (SourceCodeInfo *this,bool deterministic,uint8 *target)

{
  int iVar1;
  void *pvVar2;
  bool bVar3;
  Type *this_00;
  uint8 *puVar4;
  uint uVar5;
  uint uVar6;
  byte *pbVar7;
  int index;
  
  iVar1 = (this->location_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    index = 0;
    do {
      this_00 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::TypeHandler>
                          (&(this->location_).super_RepeatedPtrFieldBase,index);
      *target = '\n';
      pbVar7 = target + 1;
      uVar6 = this_00->_cached_size_;
      uVar5 = uVar6;
      if (0x7f < uVar6) {
        do {
          *pbVar7 = (byte)uVar6 | 0x80;
          uVar5 = uVar6 >> 7;
          pbVar7 = pbVar7 + 1;
          bVar3 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar3);
      }
      *pbVar7 = (byte)uVar5;
      target = SourceCodeInfo_Location::InternalSerializeWithCachedSizesToArray
                         (this_00,false,pbVar7 + 1);
      index = index + 1;
    } while (index != iVar1);
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    puVar4 = internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),target);
    return puVar4;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* SourceCodeInfo::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.SourceCodeInfo)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .google.protobuf.SourceCodeInfo.Location location = 1;
  for (unsigned int i = 0, n = this->location_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        1, this->location(i), deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.SourceCodeInfo)
  return target;
}